

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

void mpc_input_delete(mpc_input_t *i)

{
  free(i->filename);
  if (i->type == 0) {
    free(i->string);
  }
  if (i->type == 2) {
    free(i->buffer);
  }
  free(i->marks);
  free(i->lasts);
  free(i);
  return;
}

Assistant:

static void mpc_input_delete(mpc_input_t *i) {

  free(i->filename);

  if (i->type == MPC_INPUT_STRING) { free(i->string); }
  if (i->type == MPC_INPUT_PIPE) { free(i->buffer); }

  free(i->marks);
  free(i->lasts);
  free(i);
}